

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O2

uint32_t tinyusdz::detail::utf8_len(uchar c)

{
  uint32_t uVar1;
  uint uVar2;
  undefined7 in_register_00000039;
  
  if ((char)c < '\0') {
    uVar2 = (uint)CONCAT71(in_register_00000039,c);
    if ((uVar2 & 0xffffffe0) == 0xc0) {
      uVar1 = 2;
    }
    else {
      if ((uVar2 & 0xfffffff0) != 0xe0) {
        return (uint)((uVar2 & 0xfffffff8) == 0xf0) << 2;
      }
      uVar1 = 3;
    }
  }
  else {
    uVar1 = 1;
  }
  return uVar1;
}

Assistant:

inline uint32_t utf8_len(const unsigned char c) {
      if (c <= 127) {
        // ascii
        return 1;
      } else if ((c & 0xE0) == 0xC0) {
        return 2;
      } else if ((c & 0xF0) == 0xE0) {
        return 3;
      } else if ((c & 0xF8) == 0xF0) {
        return 4;
      }

      // invalid
      return 0;
}